

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww_test.c
# Opt level: O1

bool_t wwTest(void)

{
  bool_t bVar1;
  int iVar2;
  word wVar3;
  size_t sVar4;
  uint uVar5;
  word a [8];
  word b [8];
  word c [8];
  word local_e8;
  word local_e0;
  word local_d8 [4];
  long local_b8;
  long local_b0;
  word local_a8 [8];
  word local_68 [9];
  uint uVar6;
  
  uVar5 = 0;
  uVar6 = 0;
  wwSetW(&local_e8,8,0);
  bVar1 = wwIsZero(&local_e8,8);
  if (bVar1 != 0) {
    bVar1 = wwIsZero_fast(&local_e8,8);
    if (bVar1 != 0) {
      wwSetZero(&local_e8,8);
      bVar1 = wwIsZero(&local_e8,8);
      if (bVar1 != 0) {
        bVar1 = wwIsZero_fast(&local_e8,8);
        uVar5 = uVar6;
        if (bVar1 != 0) {
          wwSetW(&local_e8,8,0x36);
          bVar1 = wwIsZero(&local_e8,8);
          if (bVar1 == 0) {
            bVar1 = wwIsZero_fast(&local_e8,8);
            if (bVar1 == 0) {
              bVar1 = wwIsW(&local_e8,8,0x36);
              if (bVar1 != 0) {
                bVar1 = wwIsW_fast(&local_e8,8,0x36);
                if (bVar1 != 0) {
                  bVar1 = wwIsW(&local_e8,8,0x5c);
                  if (bVar1 == 0) {
                    bVar1 = wwIsW_fast(&local_e8,8,0x5c);
                    if (bVar1 == 0) {
                      iVar2 = wwCmpW(&local_e8,8,0x36);
                      if (iVar2 == 0) {
                        iVar2 = wwCmpW_fast(&local_e8,8,0x36);
                        if (iVar2 == 0) {
                          iVar2 = wwCmpW(&local_e8,8,0x5c);
                          if (iVar2 < 0) {
                            iVar2 = wwCmpW_fast(&local_e8,8,0x5c);
                            if (iVar2 < 0) {
                              wwRepW(&local_e8,8,0x36);
                              bVar1 = wwIsZero(&local_e8,8);
                              if (bVar1 == 0) {
                                bVar1 = wwIsZero_fast(&local_e8,8);
                                if (bVar1 == 0) {
                                  bVar1 = wwIsRepW(&local_e8,8,0x36);
                                  if (bVar1 != 0) {
                                    bVar1 = wwIsRepW_fast(&local_e8,8,0x36);
                                    if (bVar1 != 0) {
                                      bVar1 = wwIsRepW(&local_e8,8,0x5c);
                                      if (bVar1 == 0) {
                                        bVar1 = wwIsRepW_fast(&local_e8,8,0x5c);
                                        if (bVar1 == 0) {
                                          wwCopy(&local_e8,&local_e8,8);
                                          bVar1 = wwEq(&local_e8,&local_e8,8);
                                          if (bVar1 != 0) {
                                            bVar1 = wwEq_fast(&local_e8,&local_e8,8);
                                            if (bVar1 != 0) {
                                              wwRepW(local_a8,8,0x5c);
                                              bVar1 = wwEq(&local_e8,local_a8,8);
                                              if (bVar1 == 0) {
                                                bVar1 = wwEq_fast(&local_e8,local_a8,8);
                                                if (bVar1 == 0) {
                                                  iVar2 = wwCmp(&local_e8,local_a8,8);
                                                  if (iVar2 < 0) {
                                                    iVar2 = wwCmp_fast(&local_e8,local_a8,8);
                                                    if (iVar2 < 0) {
                                                      iVar2 = wwCmp2(&local_e8,8,local_a8,7);
                                                      if (0 < iVar2) {
                                                        iVar2 = wwCmp2_fast(&local_e8,8,local_a8,7);
                                                        if (0 < iVar2) {
                                                          wwSwap(&local_e8,local_a8,8);
                                                          iVar2 = wwCmp(&local_e8,local_a8,8);
                                                          if (0 < iVar2) {
                                                            iVar2 = wwCmp_fast(&local_e8,local_a8,8)
                                                            ;
                                                            if (0 < iVar2) {
                                                              iVar2 = wwCmp2(&local_e8,7,local_a8,8)
                                                              ;
                                                              if (iVar2 < 0) {
                                                                iVar2 = wwCmp2_fast(&local_e8,7,
                                                                                    local_a8,8);
                                                                if (iVar2 < 0) {
                                                                  uVar5 = 0;
                                                                  bVar1 = wwTestBit(local_a8,0);
                                                                  if (bVar1 == 0) {
                                                                    bVar1 = wwTestBit(local_a8,1);
                                                                    if (bVar1 != 0) {
                                                                      bVar1 = wwTestBit(local_a8,
                                                  0x40);
                                                  if (bVar1 == 0) {
                                                    bVar1 = wwTestBit(local_a8,0x41);
                                                    if (bVar1 != 0) {
                                                      bVar1 = wwTestBit(local_a8,0x3f);
                                                      if (bVar1 == 0) {
                                                        bVar1 = wwTestBit(local_a8,0x7f);
                                                        if (bVar1 == 0) {
                                                          wVar3 = wwGetBits(local_a8,0x40,6);
                                                          if (wVar3 == 0x36) {
                                                            wVar3 = wwGetBits(local_a8,0x41,5);
                                                            if (wVar3 == 0x1b) {
                                                              wwSetBit(local_a8,0x3f,1);
                                                              bVar1 = wwTestBit(local_a8,0x3f);
                                                              if (bVar1 != 0) {
                                                                wwFlipBit(local_a8,0x3f);
                                                                bVar1 = wwTestBit(local_a8,0x3f);
                                                                if (bVar1 == 0) {
                                                                  uVar5 = 0;
                                                                  wwSetBit(local_a8,0x3f,0);
                                                                  bVar1 = wwTestBit(local_a8,0x3f);
                                                                  if (bVar1 == 0) {
                                                                    wwSetBits(local_a8,0x3e,7,0x36);
                                                                    wVar3 = wwGetBits(local_a8,0x3e,
                                                                                      7);
                                                                    if (wVar3 == 0x36) {
                                                                      wwXor(local_68,&local_e8,
                                                                            local_a8,8);
                                                                      wwXor2(local_68,&local_e8,8);
                                                                      wwXor2(local_68,local_a8,8);
                                                                      bVar1 = wwIsZero(local_68,8);
                                                                      if (bVar1 != 0) {
                                                                        wwCopy(local_68,local_a8,8);
                                                                        wwXor(local_68,local_68,
                                                                              local_68,8);
                                                                        bVar1 = wwIsZero(local_68,8)
                                                                        ;
                                                                        if (bVar1 != 0) {
                                                                          wwCopy(local_68,&local_e8,
                                                                                 8);
                                                                          wwXor2(local_68,local_68,8
                                                                                );
                                                                          bVar1 = wwIsZero(local_68,
                                                  8);
                                                  if (bVar1 != 0) {
                                                    sVar4 = wwLoZeroBits(&local_e8,8);
                                                    if (sVar4 == 2) {
                                                      sVar4 = wwHiZeroBits(&local_e8,8);
                                                      if (sVar4 == 0x39) {
                                                        sVar4 = wwLoZeroBits(local_68,8);
                                                        if (sVar4 == 0x200) {
                                                          sVar4 = wwLoZeroBits(local_68,8);
                                                          if (sVar4 == 0x200) {
                                                            wwCopy(local_a8,&local_e8,8);
                                                            wwTrimHi(local_a8,8,0x183);
                                                            sVar4 = wwHiZeroBits(local_a8,8);
                                                            if (sVar4 == 0x7d) {
                                                              wwTrimLo(local_a8,8,0x45);
                                                              sVar4 = wwLoZeroBits(local_a8,8);
                                                              if (sVar4 == 0x46) {
                                                                wVar3 = wwShHiCarry(&local_e8,8,0x40
                                                                                    ,0x5c);
                                                                if (wVar3 == 0x5c) {
                                                                  bVar1 = wwIsRepW(&local_e8,8,0x5c)
                                                                  ;
                                                                  if (bVar1 != 0) {
                                                                    wVar3 = wwShLoCarry(&local_e8,8,
                                                                                        0x40,0x5c);
                                                                    if (wVar3 == 0x5c) {
                                                                      bVar1 = wwIsRepW(&local_e8,8,
                                                                                       0x5c);
                                                                      if (bVar1 != 0) {
                                                                        wVar3 = wwShHiCarry(&
                                                  local_e8,8,0x3f,0x5c);
                                                  if (wVar3 == 0x2e) {
                                                    bVar1 = wwIsRepW(&local_e8,8,0x2e);
                                                    if (bVar1 != 0) {
                                                      wVar3 = wwShLoCarry(&local_e8,8,0x3f,0x2e);
                                                      if (wVar3 == 0x5c) {
                                                        bVar1 = wwIsRepW(&local_e8,8,0x5c);
                                                        if (bVar1 != 0) {
                                                          wwShHi(&local_e8,8,0x40);
                                                          bVar1 = wwIsRepW(&local_e0,7,0x5c);
                                                          if ((bVar1 != 0) && (local_e8 == 0)) {
                                                            wwShLo(&local_e8,8,0x80);
                                                            bVar1 = wwIsRepW(&local_e8,6,0x5c);
                                                            if ((bVar1 != 0) &&
                                                               ((local_b8 == 0 && (local_b0 == 0))))
                                                            {
                                                              wwShHi(&local_e8,6,0x7f);
                                                              bVar1 = wwIsRepW(local_d8,4,0x2e);
                                                              if (bVar1 != 0) {
                                                                wwShLo(local_d8,4,0x7f);
                                                                bVar1 = wwIsRepW(local_d8,2,0x5c);
                                                                uVar5 = (uint)(bVar1 != 0);
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

bool_t wwTest()
{
	word a[8];
	word b[8];
	word c[8];
	// заполнение и сравнение
	if ((wwSetW(a, COUNT_OF(a), 0), FALSE) ||
			!SAFE(wwIsZero)(a, 8) || !FAST(wwIsZero)(a, 8) ||
		(wwSetZero(a, COUNT_OF(a)), FALSE) ||
			!SAFE(wwIsZero)(a, 8) || !FAST(wwIsZero)(a, 8) ||
		(wwSetW(a, COUNT_OF(a), 0x36), FALSE) ||
			SAFE(wwIsZero)(a, 8) || FAST(wwIsZero)(a, 8) ||
			!SAFE(wwIsW)(a, 8, 0x36) || !FAST(wwIsW)(a, 8, 0x36) ||
			SAFE(wwIsW)(a, 8, 0x5C) || FAST(wwIsW)(a, 8, 0x5C) ||
			SAFE(wwCmpW)(a, 8, 0x36) != 0 || FAST(wwCmpW)(a, 8, 0x36) != 0 ||
			SAFE(wwCmpW)(a, 8, 0x5C) >=0 || FAST(wwCmpW)(a, 8, 0x5C) >= 0 ||
		(wwRepW(a, COUNT_OF(a), 0x36), FALSE) ||
			SAFE(wwIsZero)(a, 8) || FAST(wwIsZero)(a, 8) ||
			!SAFE(wwIsRepW)(a, 8, 0x36) || !FAST(wwIsRepW)(a, 8, 0x36) ||
			SAFE(wwIsRepW)(a, 8, 0x5C) || FAST(wwIsRepW)(a, 8, 0x5C))
		return FALSE;
	// копирование и сравнение
	if ((wwCopy(a, a, 8), FALSE) ||
			!SAFE(wwEq)(a, a, 8) || !FAST(wwEq)(a, a, 8) ||
		(wwRepW(b, 8, 0x5C), FALSE) ||
			SAFE(wwEq)(a, b, 8) || FAST(wwEq)(a, b, 8) ||
			SAFE(wwCmp)(a, b, 8) >= 0 || FAST(wwCmp)(a, b, 8) >= 0 ||
			SAFE(wwCmp2)(a, 8, b, 7) <= 0 || FAST(wwCmp2)(a, 8, b, 7) <= 0 ||
		(wwSwap(a, b, 8), FALSE) ||
			SAFE(wwCmp)(a, b, 8) <= 0 || FAST(wwCmp)(a, b, 8) <= 0 ||
			SAFE(wwCmp2)(a, 7, b, 8) >= 0 || FAST(wwCmp2)(a, 7, b, 8) >= 0)
		return FALSE;
	// операции с битами
	ASSERT(wwIsRepW(b, 8, 0x36));
	if (wwTestBit(b, 0) || !wwTestBit(b, 1) ||
		wwTestBit(b, 0 + B_PER_W) || !wwTestBit(b, 1 + B_PER_W) ||
		wwTestBit(b, B_PER_W - 1) || wwTestBit(b, 2 * B_PER_W - 1) ||
		wwGetBits(b, B_PER_W, 6) != 0x36 ||
		wwGetBits(b, B_PER_W + 1, 5) != (0x36 >> 1) ||
		(wwSetBit(b, B_PER_W - 1, TRUE), FALSE) ||
			!wwTestBit(b, B_PER_W - 1) ||
		(wwFlipBit(b, B_PER_W - 1), FALSE) ||
			wwTestBit(b, B_PER_W - 1) ||
		(wwSetBit(b, B_PER_W - 1, FALSE), FALSE) ||
			wwTestBit(b, B_PER_W - 1) ||
		(wwSetBits(b, B_PER_W - 2, 7, 0x36), FALSE) ||
			wwGetBits(b, B_PER_W - 2, 7) != 0x36)
		return FALSE;
	// XOR
	if ((wwXor(c, a, b, 8), wwXor2(c, a, 8), wwXor2(c, b, 8), FALSE) ||
			!wwIsZero(c, 8) ||
		(wwCopy(c, b, 8), wwXor(c, c, c, 8), FALSE) ||
			!wwIsZero(c, 8) ||
		(wwCopy(c, a, 8), wwXor2(c, c, 8), FALSE) ||
			!wwIsZero(c, 8))
		return FALSE;
	// нулевые разряды
	ASSERT(wwIsRepW(a, 8, 0x5C) && wwIsZero(c, 8));
	if (wwLoZeroBits(a, 8) != 2 ||
		wwHiZeroBits(a, 8) != B_PER_W - 7 ||
		wwLoZeroBits(c, 8) != B_PER_W * 8 ||
		wwLoZeroBits(c, 8) != B_PER_W * 8 ||
		(wwCopy(b, a, 8), wwTrimHi(b, 8, 6 * B_PER_W + 3), FALSE) ||
			wwHiZeroBits(b, 8) != 2 * B_PER_W - 3 ||
		(wwTrimLo(b, 8, B_PER_W + 5), FALSE) ||
			wwLoZeroBits(b, 8) != B_PER_W + 6)
		return FALSE;
	// сдвиги
	ASSERT(wwIsRepW(a, 8, 0x5C));
	if (wwShHiCarry(a, 8, B_PER_W, 0x5C) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		wwShLoCarry(a, 8, B_PER_W, 0x5C) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		wwShHiCarry(a, 8, B_PER_W - 1, 0x5C) != (0x5C >> 1) ||
		!wwIsRepW(a, 8, 0x5C >> 1) ||
		wwShLoCarry(a, 8, B_PER_W - 1, 0x5C >> 1) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		(wwShHi(a, 8, B_PER_W), FALSE) ||
			!wwIsRepW(a + 1, 7, 0x5C) || a[0] != 0 ||
		(wwShLo(a, 8, 2 * B_PER_W), FALSE) ||
			!wwIsRepW(a, 6, 0x5C) || a[6] != 0 || a[7] != 0 ||
		(wwShHi(a, 6, 2 * B_PER_W - 1), FALSE) ||
			!wwIsRepW(a + 2, 4, 0x5C >> 1) ||
		(wwShLo(a + 2, 4, 2 * B_PER_W - 1), FALSE) ||
			!wwIsRepW(a + 2, 2, 0x5C))
		return FALSE;
	// все нормально
	return TRUE;
}